

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_phone_list.c
# Opt level: O3

void print_phone_list(acmod_id_t *p,uint32 n_p,char *btw,acmod_set_t *acmod_set)

{
  uint32 uVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  char fmt [16];
  char local_48 [24];
  
  if (n_p == 0) {
    sprintf(local_48,"%%%ds%%s",0);
  }
  else {
    uVar8 = 0;
    uVar6 = 0;
    do {
      pcVar2 = acmod_set_id2name(acmod_set,p[uVar8]);
      sVar3 = strlen(pcVar2);
      uVar4 = (uint)sVar3;
      if ((uint)sVar3 < uVar6) {
        uVar4 = uVar6;
      }
      uVar6 = uVar4;
      uVar8 = uVar8 + 1;
    } while (n_p != uVar8);
    sprintf(local_48,"%%%ds%%s",(ulong)uVar6);
    if (n_p != 0) {
      uVar4 = 0;
      do {
        uVar5 = (int)(0x50 / (ulong)uVar6) + uVar4;
        uVar1 = n_p;
        if (uVar5 < n_p) {
          uVar1 = uVar5;
        }
        if (uVar4 < uVar1) {
          uVar7 = (ulong)uVar4;
          uVar8 = uVar7;
          do {
            pcVar2 = " ";
            if (btw[uVar8] != '\0') {
              pcVar2 = "+";
            }
            printf(local_48,"",pcVar2);
            uVar8 = uVar8 + 1;
          } while (uVar8 < uVar1);
          putchar(10);
          if (uVar4 < uVar1) {
            do {
              pcVar2 = acmod_set_id2name(acmod_set,p[uVar7]);
              printf(local_48,pcVar2," ");
              uVar7 = uVar7 + 1;
            } while (uVar7 < uVar1);
          }
        }
        else {
          putchar(10);
        }
        putchar(10);
        putchar(10);
        uVar4 = uVar5;
      } while (uVar5 < n_p);
    }
  }
  return;
}

Assistant:

void
print_phone_list(acmod_id_t *p,
		 uint32 n_p,
		 char *btw,
		 acmod_set_t *acmod_set)
{
    uint32 i, j, k;
    uint32 mpl, l;
    char fmt[16];
    uint32 ppl;

    for (i = 0, mpl = 0; i < n_p; i++) {
	l = strlen(acmod_set_id2name(acmod_set, p[i]));
	if (l > mpl) mpl = l;
    }

    sprintf(fmt, "%%%ds%%s", mpl);

    ppl = 80 / mpl;

    /* print out the phone sequence in rows of at most PPL phones */
    for (i = 0; i < n_p; i += ppl) {
	for (j = i, k = (i + ppl > n_p ? n_p : i + ppl); j < k; j++) {
	    printf(fmt, "", (btw[j] ? "+" : " "));
	}
	printf("\n");

	for (j = i, k = (i + ppl > n_p ? n_p : i + ppl); j < k; j++) {
	    printf(fmt, acmod_set_id2name(acmod_set, p[j]), " ");
	}
	printf("\n");
	printf("\n");
    }
}